

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

char * gguf_get_arr_str(gguf_context *ctx,int64_t key_id,size_t i)

{
  int64_t iVar1;
  const_reference pvVar2;
  gguf_type *pgVar3;
  char *pcVar4;
  size_type in_RDX;
  size_type in_RSI;
  long in_RDI;
  
  if (-1 < (long)in_RSI) {
    iVar1 = gguf_get_n_kv((gguf_context *)0x18f23f);
    if ((long)in_RSI < iVar1) {
      pvVar2 = std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                         ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),in_RSI);
      pgVar3 = gguf_kv::get_type(pvVar2);
      if (*pgVar3 != GGUF_TYPE_STRING) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp"
                   ,0x312,"GGML_ASSERT(%s) failed","ctx->kv[key_id].get_type() == GGUF_TYPE_STRING")
        ;
      }
      pvVar2 = std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                         ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),in_RSI);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&pvVar2->data_string,in_RDX);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      return pcVar4;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp",0x311
             ,"GGML_ASSERT(%s) failed","key_id >= 0 && key_id < gguf_get_n_kv(ctx)");
}

Assistant:

const char * gguf_get_arr_str(const struct gguf_context * ctx, int64_t key_id, size_t i) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));
    GGML_ASSERT(ctx->kv[key_id].get_type() == GGUF_TYPE_STRING);
    return ctx->kv[key_id].data_string[i].c_str();
}